

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaProductForm.cpp
# Opt level: O3

void __thiscall ProductFormUpdate::ftran(ProductFormUpdate *this,HVector *rhs)

{
  pointer pdVar1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  pointer piVar7;
  double dVar8;
  
  if (this->valid_ == true) {
    iVar3 = rhs->count;
    if (0 < iVar3) {
      lVar5 = 0;
      do {
        (rhs->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start[(rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5]] = '\x01';
        lVar5 = lVar5 + 1;
        iVar3 = rhs->count;
      } while (lVar5 < iVar3);
    }
    iVar4 = this->update_count_;
    if (0 < iVar4) {
      lVar5 = 0;
      do {
        iVar3 = (this->pivot_index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5];
        pdVar1 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (ABS(pdVar1[iVar3]) <= 1e-14) {
          pdVar1[iVar3] = 0.0;
        }
        else {
          dVar8 = pdVar1[iVar3] /
                  (this->pivot_value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5];
          pdVar1[iVar3] = dVar8;
          piVar7 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = (long)piVar7[lVar5];
          if (piVar7[lVar5] < piVar7[lVar5 + 1]) {
            do {
              iVar3 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar6];
              pdVar1 = (rhs->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar1[iVar3] =
                   (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6] * -dVar8 + pdVar1[iVar3];
              pcVar2 = (rhs->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (pcVar2[iVar3] == '\0') {
                pcVar2[iVar3] = '\x01';
                iVar4 = rhs->count;
                rhs->count = iVar4 + 1;
                (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar4] = iVar3;
                piVar7 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < piVar7[lVar5 + 1]);
            iVar4 = this->update_count_;
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar4);
      iVar3 = rhs->count;
    }
    if (0 < iVar3) {
      lVar5 = 0;
      do {
        (rhs->cwork).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start[(rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5]] = '\0';
        lVar5 = lVar5 + 1;
      } while (lVar5 < rhs->count);
    }
  }
  return;
}

Assistant:

void ProductFormUpdate::ftran(HVector& rhs) const {
  if (!valid_) return;
  assert(rhs.size == num_row_);
  assert((int)start_.size() == update_count_ + 1);
  // Use the zeroed rhs.cwork to record whether a row is in the index
  // list. If RHS fill-in occurs in a row, then we have to add it to
  // the list. We're not tracking cancellation, so we don't need to
  // know where a row appears in the list
  vector<char>& in_index = rhs.cwork;
  for (HighsInt iX = 0; iX < rhs.count; iX++) in_index[rhs.index[iX]] = 1;

  for (HighsInt iX = 0; iX < update_count_; iX++) {
    const HighsInt pivot_index = pivot_index_[iX];
    double pivot_value = rhs.array[pivot_index];
    if (fabs(pivot_value) > kHighsTiny) {
      assert(in_index[pivot_index]);
      pivot_value /= pivot_value_[iX];
      rhs.array[pivot_index] = pivot_value;
      for (HighsInt iEl = start_[iX]; iEl < start_[iX + 1]; iEl++) {
        HighsInt iRow = index_[iEl];
        rhs.array[iRow] -= pivot_value * value_[iEl];
        if (in_index[iRow]) continue;
        in_index[iRow] = 1;
        rhs.index[rhs.count++] = iRow;
      }
    } else {
      rhs.array[pivot_index] = 0;
    }
  }
  // Zero the in_index entries used to point into the index list
  for (HighsInt iX = 0; iX < rhs.count; iX++) in_index[rhs.index[iX]] = 0;
}